

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink7.c
# Opt level: O3

Gia_Man_t * Unm_ManFree(Unm_Man_t *p)

{
  Gia_Man_t *p_00;
  Hash_IntMan_t *__ptr;
  int *piVar1;
  Vec_Wrd_t *__ptr_00;
  Vec_Int_t *pVVar2;
  
  p_00 = p->pNew;
  p->pNew = (Gia_Man_t *)0x0;
  Gia_ManHashStop(p_00);
  pVVar2 = p_00->vLevels;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      p_00->vLevels->pArray = (int *)0x0;
      pVVar2 = p_00->vLevels;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_0071b7a3;
    }
    free(pVVar2);
    p_00->vLevels = (Vec_Int_t *)0x0;
  }
LAB_0071b7a3:
  Gia_ManSetRegNum(p_00,p->pGia->nRegs);
  __ptr_00 = p->vTruths;
  if (__ptr_00 != (Vec_Wrd_t *)0x0) {
    if (__ptr_00->pArray != (word *)0x0) {
      free(__ptr_00->pArray);
      p->vTruths->pArray = (word *)0x0;
      __ptr_00 = p->vTruths;
      if (__ptr_00 == (Vec_Wrd_t *)0x0) goto LAB_0071b7ed;
    }
    free(__ptr_00);
    p->vTruths = (Vec_Wrd_t *)0x0;
  }
LAB_0071b7ed:
  pVVar2 = p->vLeaves;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      p->vLeaves->pArray = (int *)0x0;
      pVVar2 = p->vLeaves;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_0071b829;
    }
    free(pVVar2);
    p->vLeaves = (Vec_Int_t *)0x0;
  }
LAB_0071b829:
  pVVar2 = p->vUsed;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      p->vUsed->pArray = (int *)0x0;
      pVVar2 = p->vUsed;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_0071b865;
    }
    free(pVVar2);
    p->vUsed = (Vec_Int_t *)0x0;
  }
LAB_0071b865:
  pVVar2 = p->vId2Used;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      p->vId2Used->pArray = (int *)0x0;
      pVVar2 = p->vId2Used;
      if (pVVar2 == (Vec_Int_t *)0x0) goto LAB_0071b8a1;
    }
    free(pVVar2);
    p->vId2Used = (Vec_Int_t *)0x0;
  }
LAB_0071b8a1:
  __ptr = p->pHash;
  pVVar2 = __ptr->vObjs;
  piVar1 = pVVar2->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar2);
  pVVar2 = __ptr->vTable;
  piVar1 = pVVar2->pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  free(pVVar2);
  free(__ptr);
  free(p);
  Gia_ManStop(p_00);
  return (Gia_Man_t *)0x0;
}

Assistant:

Gia_Man_t * Unm_ManFree( Unm_Man_t * p )
{
    Gia_Man_t * pTemp = p->pNew; p->pNew = NULL;
    Gia_ManHashStop( pTemp );
    Vec_IntFreeP( &pTemp->vLevels );
    Gia_ManSetRegNum( pTemp, Gia_ManRegNum(p->pGia) );
    // truth tables
    Vec_WrdFreeP( &p->vTruths );
    Vec_IntFreeP( &p->vLeaves );
    Vec_IntFreeP( &p->vUsed );
    Vec_IntFreeP( &p->vId2Used );
    // free data structures
    Hash_IntManStop( p->pHash );
    ABC_FREE( p );

    Gia_ManStop( pTemp );
    pTemp = NULL;

    return pTemp;
}